

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxCaseStatement::Resolve(FxCaseStatement *this,FCompileContext *ctx)

{
  BYTE BVar1;
  int iVar2;
  undefined4 extraout_var;
  FxIntCast *this_00;
  FxExpression *pFVar3;
  PString *pPVar4;
  FString local_30;
  int local_24;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar3 = this->Condition;
  if (pFVar3 != (FxExpression *)0x0) {
    iVar2 = (*pFVar3->_vptr_FxExpression[2])(pFVar3,ctx);
    this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar2);
    if ((FxExpression *)CONCAT44(extraout_var,iVar2) == (FxExpression *)0x0) goto LAB_00539eee;
  }
  if (this->Condition == (FxExpression *)0x0) {
    return &this->super_FxExpression;
  }
  iVar2 = (*this->Condition->_vptr_FxExpression[3])();
  if ((char)iVar2 == '\0') {
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Case label must be a constant value");
LAB_00539eee:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  pFVar3 = this->Condition;
  if (pFVar3->ValueType == (PType *)TypeName) {
    pPVar4 = (PString *)pFVar3[1]._vptr_FxExpression;
    if (pPVar4 == TypeString) {
      FString::AttachToOther(&local_30,&pFVar3[1].ScriptPosition.FileName);
    }
    else {
      local_30.Chars = pFVar3[1].ScriptPosition.FileName.Chars;
    }
    ExpVal::GetName((ExpVal *)&local_24);
    this->CaseValue = local_24;
  }
  else {
    this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar3 = this->Condition;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,&pFVar3->ScriptPosition);
    (this_00->super_FxExpression).ValueType = (PType *)0x0;
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_IntCast;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070f5b0;
    this_00->basex = pFVar3;
    (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
    this_00->NoWarn = false;
    this_00->Explicit = false;
    this->Condition = (FxExpression *)this_00;
    pFVar3 = FxIntCast::Resolve(this_00,ctx);
    this->Condition = pFVar3;
    if (pFVar3 == (FxExpression *)0x0) goto LAB_00539eee;
    pPVar4 = (PString *)pFVar3[1]._vptr_FxExpression;
    if (pPVar4 == TypeString) {
      FString::AttachToOther(&local_30,&pFVar3[1].ScriptPosition.FileName);
    }
    else {
      local_30.Chars = pFVar3[1].ScriptPosition.FileName.Chars;
    }
    BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      iVar2 = (int)(double)local_30.Chars;
    }
    else {
      iVar2 = 0;
      if (BVar1 == '\0') {
        iVar2 = (int)local_30.Chars;
      }
    }
    this->CaseValue = iVar2;
  }
  if (pPVar4 != TypeString) {
    return &this->super_FxExpression;
  }
  FString::~FString(&local_30);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxCaseStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Condition, ctx);

	if (Condition != nullptr)
	{
		if (!Condition->isConstant())
		{
			ScriptPosition.Message(MSG_ERROR, "Case label must be a constant value");
			delete this;
			return nullptr;
		}
		// Case labels can be ints or names.
		if (Condition->ValueType != TypeName)
		{
			Condition = new FxIntCast(Condition, false);
			SAFE_RESOLVE(Condition, ctx);
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetInt();
		}
		else
		{
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetName();
		}
	}
	return this;
}